

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *
testing::internal::ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>>::
PerformAction<std::experimental::fundamentals_v1::optional<InotifyEvent>()>
          (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InotifyEventType local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  char local_58;
  undefined1 local_50 [40];
  char local_28;
  
  pAVar1 = (ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *)
           operator_new(0x38);
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
            ((Result *)
             &((anon_union_40_2_e8b08be2_for__Optional_base<InotifyEvent,_true>_2 *)local_50)->
              _M_payload,action,args);
  local_58 = '\0';
  if (local_28 == '\x01') {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)&(((anon_union_40_2_e8b08be2_for__Optional_base<InotifyEvent,_true>_2 *)
                         local_50)->_M_payload).path + 0x10);
    local_80 = local_50._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._8_8_ == paVar2) {
      local_68._8_8_ = local_50._32_8_;
      local_78._M_p = (pointer)&local_68;
    }
    else {
      local_78._M_p = (pointer)local_50._8_8_;
    }
    local_68._M_allocated_capacity._1_7_ = local_50._25_7_;
    local_68._M_local_buf[0] = local_50[0x18];
    local_70 = local_50._16_8_;
    local_50._16_8_ = 0;
    local_50[0x18] = 0;
    local_58 = '\x01';
    local_50._8_8_ = paVar2;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_001acb58;
  (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>._M_engaged = false;
  if (local_58 == '\x01') {
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.type =
         local_80;
    paVar2 = &(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.
              path.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0 + 8) =
         paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p == &local_68) {
      paVar2->_M_allocated_capacity = local_68._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.
               path.field_2 + 8) = local_68._8_8_;
    }
    else {
      (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
      _M_dataplus._M_p = local_78._M_p;
      (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
      field_2._M_allocated_capacity = local_68._M_allocated_capacity;
    }
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
    _M_string_length = local_70;
    local_68._M_allocated_capacity = local_68._M_allocated_capacity & 0xffffffffffffff00;
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>._M_engaged = true;
  }
  if ((local_28 == '\x01') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_40_2_e8b08be2_for__Optional_base<InotifyEvent,_true>_2 *)local_50)->
                 _M_payload).path + 0x10U))) {
    operator_delete((void *)local_50._8_8_,CONCAT71(local_50._25_7_,local_50[0x18]) + 1);
  }
  return pAVar1;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }